

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * kj::strTree<kj::String>(StringTree *__return_storage_ptr__,String *params)

{
  StringTree local_48;
  
  local_48.text.content.size_ = (params->content).size_;
  local_48.size_ = 0;
  if (local_48.text.content.size_ != 0) {
    local_48.size_ = local_48.text.content.size_ - 1;
  }
  local_48.text.content.ptr = (params->content).ptr;
  local_48.text.content.disposer = (params->content).disposer;
  (params->content).ptr = (char *)0x0;
  (params->content).size_ = 0;
  local_48.branches.ptr = (Branch *)0x0;
  local_48.branches.size_ = 0;
  local_48.branches.disposer = (ArrayDisposer *)0x0;
  StringTree::StringTree(__return_storage_ptr__,&local_48);
  StringTree::~StringTree(&local_48);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}